

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

void __thiscall ncnn::ParamDict::clear(ParamDict *this)

{
  undefined8 *puVar1;
  int *piVar2;
  void *__ptr;
  long *plVar3;
  long lVar4;
  void *local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  long *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  lVar4 = 0;
  do {
    *(undefined4 *)((long)&this->params[0].loaded + lVar4) = 0;
    uStack_58 = 0;
    uStack_54 = 0;
    uStack_50 = 0;
    local_68 = (void *)0x0;
    uStack_60 = 0;
    uStack_5c = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = (long *)0x0;
    uStack_40 = 0;
    if ((void **)((long)&this->params[0].v.data + lVar4) != &local_68) {
      piVar2 = *(int **)((long)&this->params[0].v.refcount + lVar4);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          __ptr = *(void **)((long)&this->params[0].v.data + lVar4);
          plVar3 = *(long **)((long)&this->params[0].v.allocator + lVar4);
          if (plVar3 == (long *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (**(code **)(*plVar3 + 0x18))();
          }
        }
      }
      puVar1 = (undefined8 *)((long)&this->params[0].v.cstep + lVar4);
      *(undefined8 *)((long)puVar1 + -0x2c) = 0;
      *(undefined8 *)((long)puVar1 + -0x24) = 0;
      puVar1[-7] = 0;
      puVar1[-6] = 0;
      puVar1[-2] = 0;
      puVar1[-1] = 0;
      *puVar1 = 0;
      puVar1[-7] = local_68;
      puVar1[-6] = CONCAT44(uStack_5c,uStack_60);
      puVar1[-5] = CONCAT44(uStack_54,uStack_58);
      *(undefined4 *)(puVar1 + -4) = uStack_50;
      puVar1[-3] = local_48;
      puVar1[-2] = uStack_40;
      puVar1[-1] = local_38;
      *puVar1 = uStack_30;
    }
    piVar2 = (int *)CONCAT44(uStack_5c,uStack_60);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_48 == (long *)0x0) {
          if (local_68 != (void *)0x0) {
            free(local_68);
          }
        }
        else {
          (**(code **)(*local_48 + 0x18))();
        }
      }
    }
    lVar4 = lVar4 + 0x48;
  } while (lVar4 != 0x5a0);
  return;
}

Assistant:

void ParamDict::clear()
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        params[i].loaded = 0;
        params[i].v = Mat();
    }
}